

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

drmModeAtomicReq * __thiscall QKmsDevice::threadLocalAtomicRequest(QKmsDevice *this)

{
  AtomicReqs *pAVar1;
  drmModeAtomicReq *pdVar2;
  
  if (this->m_has_atomic_support == true) {
    pAVar1 = QThreadStorage<QKmsDevice::AtomicReqs>::localData(&this->m_atomicReqs);
    pdVar2 = pAVar1->request;
    if (pdVar2 == (drmModeAtomicReq *)0x0) {
      pdVar2 = (drmModeAtomicReq *)drmModeAtomicAlloc();
      pAVar1->request = pdVar2;
    }
    return pdVar2;
  }
  return (drmModeAtomicReq *)0x0;
}

Assistant:

drmModeAtomicReq *QKmsDevice::threadLocalAtomicRequest()
{
    if (!m_has_atomic_support)
        return nullptr;

    AtomicReqs &a(m_atomicReqs.localData());
    if (!a.request)
        a.request = drmModeAtomicAlloc();

    return a.request;
}